

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_expression.hpp
# Opt level: O1

string * __thiscall
duckdb::WindowExpression::
ToString<duckdb::BoundWindowExpression,duckdb::Expression,duckdb::BoundOrderByNode>
          (string *__return_storage_ptr__,WindowExpression *this,BoundWindowExpression *entry,
          string *schema,string *function_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  byte bVar4;
  _func_int **pp_Var5;
  pointer pcVar6;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var7;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var8;
  size_type sVar9;
  size_type sVar10;
  pointer puVar11;
  pointer puVar12;
  long lVar13;
  long *plVar14;
  pointer pEVar15;
  undefined8 *puVar16;
  string *psVar17;
  InternalException *pIVar18;
  size_type *psVar19;
  ulong *puVar20;
  char *pcVar21;
  char *pcVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  anon_class_8_1_2b093797 in_R9;
  long lVar24;
  string to;
  string units;
  string sep;
  string from;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  lVar24 = *(long *)&(entry->super_Expression).super_BaseExpression.type;
  if (lVar24 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = (schema->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar6,pcVar6 + schema->_M_string_length);
  }
  else {
    local_50[0] = local_40;
    pp_Var5 = (entry->super_Expression).super_BaseExpression._vptr_BaseExpression;
    ::std::__cxx11::string::_M_construct<char*>((string *)local_50,pp_Var5,(long)pp_Var5 + lVar24);
    ::std::__cxx11::string::append((char *)local_50);
    plVar14 = (long *)::std::__cxx11::string::_M_append
                                ((char *)local_50,(ulong)(schema->_M_dataplus)._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar19 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar19) {
      lVar13 = plVar14[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar19;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar13;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar14;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar19;
    }
    __return_storage_ptr__->_M_string_length = plVar14[1];
    *plVar14 = (long)psVar19;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
  }
  if ((lVar24 != 0) && (local_50[0] != local_40)) {
    operator_delete(local_50[0]);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  lVar24 = *(long *)((long)&(this->schema).field_2 + 8) -
           (this->schema).field_2._M_allocated_capacity;
  if (lVar24 != 0) {
    local_90._M_dataplus._M_p =
         (pointer)(CONCAT44(local_90._M_dataplus._M_p._4_4_,
                            (uint)*(byte *)((long)&(this->orders).
                                                                                                      
                                                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                                  .
                                                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + 1)) ^
                  1);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,", ","");
    StringUtil::
    Join<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long,duckdb::WindowExpression::ToString<duckdb::BoundWindowExpression,duckdb::Expression,duckdb::BoundOrderByNode>(duckdb::BoundWindowExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>const&)_1_>
              (&local_b0,(StringUtil *)(this->schema).field_2._M_local_buf,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)(lVar24 >> 3),(unsigned_long)&local_d0,&local_90,in_R9);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  lVar24._0_1_ = this->ignore_nulls;
  lVar24._1_1_ = this->distinct;
  lVar24._2_1_ = this->start;
  lVar24._3_1_ = this->end;
  lVar24._4_1_ = this->exclude_clause;
  lVar24._5_3_ = *(undefined3 *)&this->field_0xed;
  if (lVar24 != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&this->ignore_nulls);
    (*(pEVar15->super_BaseExpression)._vptr_BaseExpression[8])(&local_b0,pEVar15);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  if ((this->start_expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&this->start_expr);
    (*(pEVar15->super_BaseExpression)._vptr_BaseExpression[8])(&local_b0,pEVar15);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  if ((this->end_expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (this->offset_expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    _Var7._M_head_impl =
         (this->end_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    _Var8._M_head_impl =
         (this->offset_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,", ","");
    StringUtil::
    Join<duckdb::vector<duckdb::BoundOrderByNode,true>,unsigned_long,duckdb::WindowExpression::ToString<duckdb::BoundWindowExpression,duckdb::Expression,duckdb::BoundOrderByNode>(duckdb::BoundWindowExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(duckdb::BoundOrderByNode_const&)_1_>
              (&local_b0,(StringUtil *)&this->end_expr,
               ((long)_Var8._M_head_impl - (long)_Var7._M_head_impl >> 3) * -0x5555555555555555,
               &local_d0);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if (*(char *)&(this->orders).
                super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                _M_impl.super__Vector_impl_data._M_finish == '\x01') {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((this->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&this->orders);
    (*(pEVar15->super_BaseExpression)._vptr_BaseExpression[8])(&local_d0);
    plVar14 = (long *)::std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x1dc580e);
    puVar20 = (ulong *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar20) {
      local_b0.field_2._M_allocated_capacity = *puVar20;
      local_b0.field_2._8_8_ = plVar14[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar20;
      local_b0._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_b0._M_string_length = plVar14[1];
    *plVar14 = (long)puVar20;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_allocated_capacity =
       local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((this->function_name)._M_string_length != (this->function_name).field_2._M_allocated_capacity)
  {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    sVar9 = (this->function_name)._M_string_length;
    sVar10 = (this->function_name).field_2._M_allocated_capacity;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,", ","");
    StringUtil::
    Join<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long,duckdb::WindowExpression::ToString<duckdb::BoundWindowExpression,duckdb::Expression,duckdb::BoundOrderByNode>(duckdb::BoundWindowExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>const&)_2_>
              (&local_d0,(StringUtil *)&(this->function_name)._M_string_length,
               (long)(sVar10 - sVar9) >> 3,&local_90);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_d0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    ::std::__cxx11::string::_M_replace
              ((ulong)&local_b0,0,(char *)local_b0._M_string_length,0x1f09bf5);
  }
  if ((this->partitions).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->partitions).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    puVar11 = (this->partitions).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar12 = (this->partitions).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,", ","");
    StringUtil::
    Join<duckdb::vector<duckdb::BoundOrderByNode,true>,unsigned_long,duckdb::WindowExpression::ToString<duckdb::BoundWindowExpression,duckdb::Expression,duckdb::BoundOrderByNode>(duckdb::BoundWindowExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(duckdb::BoundOrderByNode_const&)_2_>
              (&local_d0,(StringUtil *)&this->partitions,
               ((long)puVar12 - (long)puVar11 >> 3) * -0x5555555555555555,&local_90);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_d0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    ::std::__cxx11::string::_M_replace
              ((ulong)&local_b0,0,(char *)local_b0._M_string_length,0x1f09bf5);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"ROWS","");
  paVar2 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)paVar2;
  switch(*(undefined1 *)
          ((long)&(this->orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  _M_impl.super__Vector_impl_data._M_finish + 2)) {
  case 0:
  case 2:
    pIVar18 = (InternalException *)__cxa_allocate_exception(0x10);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"Unrecognized FROM in WindowExpression","");
    InternalException::InternalException(pIVar18,&local_110);
    __cxa_throw(pIVar18,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 1:
    if (*(char *)((long)&(this->orders).
                         super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                         super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 3) != '\x03') {
      ::std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x1ea8d8b);
    }
    break;
  case 3:
  case 4:
  case 9:
    ::std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x1dc5836);
    cVar3 = *(char *)((long)&(this->orders).
                             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             .
                             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 2);
    if (cVar3 == '\x03') {
LAB_00d8b119:
      local_110._M_string_length = 5;
      local_110.field_2._M_allocated_capacity._0_6_ = 0x45474e4152;
    }
    else {
      if (cVar3 != '\x04') goto LAB_00d8b081;
LAB_00d8af46:
      local_110._M_string_length = 4;
      local_110.field_2._M_allocated_capacity._0_5_ = 0x53574f52;
    }
    goto LAB_00d8b134;
  case 5:
  case 7:
  case 10:
    pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&(this->orders).
                             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             .
                             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    (*(pEVar15->super_BaseExpression)._vptr_BaseExpression[8])(&local_f0,pEVar15);
    puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_f0);
    puVar20 = puVar16 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar20) {
      local_110.field_2._M_allocated_capacity = *puVar20;
      local_110.field_2._8_8_ = puVar16[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *puVar20;
      local_110._M_dataplus._M_p = (pointer)*puVar16;
    }
    local_110._M_string_length = puVar16[1];
    *puVar16 = puVar20;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    cVar3 = *(char *)((long)&(this->orders).
                             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             .
                             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 2);
    if (cVar3 == '\a') goto LAB_00d8b119;
    if (cVar3 == '\x05') goto LAB_00d8af46;
    goto LAB_00d8b081;
  case 6:
  case 8:
  case 0xb:
    pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&(this->orders).
                             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             .
                             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    (*(pEVar15->super_BaseExpression)._vptr_BaseExpression[8])(&local_f0,pEVar15);
    plVar14 = (long *)::std::__cxx11::string::append((char *)&local_f0);
    puVar20 = (ulong *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar20) {
      local_110.field_2._M_allocated_capacity = *puVar20;
      local_110.field_2._8_8_ = plVar14[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *puVar20;
      local_110._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_110._M_string_length = plVar14[1];
    *plVar14 = (long)puVar20;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    cVar3 = *(char *)((long)&(this->orders).
                             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             .
                             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 2);
    if (cVar3 == '\b') goto LAB_00d8b119;
    if (cVar3 == '\x06') goto LAB_00d8af46;
LAB_00d8b081:
    local_110._M_string_length = 6;
    local_110.field_2._M_allocated_capacity._0_7_ = 0x5350554f5247;
LAB_00d8b134:
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    ::std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
  }
  paVar1 = &local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_allocated_capacity =
       local_110.field_2._M_allocated_capacity & 0xffffffffffffff00;
  bVar4 = *(byte *)((long)&(this->orders).
                           super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 3);
  local_110._M_dataplus._M_p = (pointer)paVar1;
  if (0xb < bVar4) goto LAB_00d8b46c;
  pbVar23 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110;
  switch(bVar4) {
  case 0:
    pIVar18 = (InternalException *)__cxa_allocate_exception(0x10);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"Unrecognized TO in WindowExpression","");
    InternalException::InternalException(pIVar18,(string *)&local_f0);
    __cxa_throw(pIVar18,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 1:
    pcVar22 = (char *)0x0;
    pcVar21 = "UNBOUNDED PRECEDING";
    break;
  case 2:
    pcVar21 = "UNBOUNDED FOLLOWING";
    pcVar22 = (char *)0x0;
    break;
  case 3:
    if (*(char *)((long)&(this->orders).
                         super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                         super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 2) == '\x01')
    goto LAB_00d8b46c;
    ::std::__cxx11::string::_M_replace((ulong)pbVar23,0,(char *)0x0,0x1dc5836);
    pcVar21 = "RANGE";
    pcVar22 = (char *)local_d0._M_string_length;
    pbVar23 = &local_d0;
    break;
  case 4:
  case 9:
    ::std::__cxx11::string::_M_replace((ulong)pbVar23,0,(char *)0x0,0x1dc5836);
    cVar3 = *(char *)((long)&(this->orders).
                             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             .
                             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 3);
    if (cVar3 == '\x03') {
LAB_00d8b3a6:
      local_f0._M_string_length = 5;
      local_f0.field_2._M_allocated_capacity._0_6_ = 0x45474e4152;
    }
    else {
      if (cVar3 == '\x04') goto LAB_00d8b2fd;
LAB_00d8b387:
      local_f0._M_string_length = 6;
      local_f0.field_2._M_allocated_capacity._0_7_ = 0x5350554f5247;
    }
    goto LAB_00d8b3c1;
  default:
    pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&this->filter_expr);
    (*(pEVar15->super_BaseExpression)._vptr_BaseExpression[8])(local_70,pEVar15);
    plVar14 = (long *)::std::__cxx11::string::append((char *)local_70);
    psVar19 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar19) {
      local_f0.field_2._M_allocated_capacity = *psVar19;
      local_f0.field_2._8_8_ = plVar14[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar19;
      local_f0._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_f0._M_string_length = plVar14[1];
    *plVar14 = (long)psVar19;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_110,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    cVar3 = *(char *)((long)&(this->orders).
                             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             .
                             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 3);
    if (cVar3 == '\a') goto LAB_00d8b3a6;
    if (cVar3 != '\x05') goto LAB_00d8b387;
    goto LAB_00d8b2fd;
  case 6:
  case 8:
  case 0xb:
    pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&this->filter_expr);
    (*(pEVar15->super_BaseExpression)._vptr_BaseExpression[8])(local_70,pEVar15);
    puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)local_70);
    psVar19 = puVar16 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar19) {
      local_f0.field_2._M_allocated_capacity = *psVar19;
      local_f0.field_2._8_8_ = puVar16[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar19;
      local_f0._M_dataplus._M_p = (pointer)*puVar16;
    }
    local_f0._M_string_length = puVar16[1];
    *puVar16 = psVar19;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_110,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    cVar3 = *(char *)((long)&(this->orders).
                             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             .
                             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 3);
    if (cVar3 == '\b') goto LAB_00d8b3a6;
    if (cVar3 != '\x06') goto LAB_00d8b387;
LAB_00d8b2fd:
    local_f0._M_string_length = 4;
    local_f0.field_2._M_allocated_capacity._0_5_ = 0x53574f52;
LAB_00d8b3c1:
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    ::std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    goto LAB_00d8b46c;
  }
  ::std::__cxx11::string::_M_replace((ulong)pbVar23,0,pcVar22,(ulong)pcVar21);
LAB_00d8b46c:
  if (*(char *)((long)&(this->orders).
                       super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                       super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 4) != '\0') {
    if (local_90._M_string_length == 0) {
      ::std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x1ea8d8b);
    }
    if (local_110._M_string_length == 0) {
      ::std::__cxx11::string::_M_replace((ulong)&local_110,0,(char *)0x0,0x1dc5836);
      ::std::__cxx11::string::_M_replace
                ((ulong)&local_d0,0,(char *)local_d0._M_string_length,0x1de19f2);
    }
  }
  if (local_110._M_string_length != 0 || local_90._M_string_length != 0) {
    ::std::operator+(&local_f0,&local_b0,&local_d0);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  if ((local_90._M_string_length == 0) || (local_110._M_string_length == 0)) {
    if (local_90._M_string_length == 0) {
      if (local_110._M_string_length == 0) goto LAB_00d8b5a8;
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_00d8b572;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    psVar17 = (string *)&local_90;
  }
  else {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00d8b572:
    psVar17 = &local_110;
  }
  ::std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(psVar17->_M_dataplus)._M_p);
LAB_00d8b5a8:
  if (*(char *)((long)&(this->orders).
                       super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                       super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 4) != '\0') {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((byte)(*(char *)((long)&(this->orders).
                              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                              .
                              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 4) - 1U) < 3) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static string ToString(const T &entry, const string &schema, const string &function_name) {
		// Start with function call
		string result = schema.empty() ? function_name : schema + "." + function_name;
		result += "(";
		if (entry.children.size()) {
			//	Only one DISTINCT is allowed (on the first argument)
			int distincts = entry.distinct ? 0 : 1;
			result += StringUtil::Join(entry.children, entry.children.size(), ", ", [&](const unique_ptr<BASE> &child) {
				return (distincts++ ? "" : "DISTINCT ") + child->ToString();
			});
		}
		// Lead/Lag extra arguments
		if (entry.offset_expr.get()) {
			result += ", ";
			result += entry.offset_expr->ToString();
		}
		if (entry.default_expr.get()) {
			result += ", ";
			result += entry.default_expr->ToString();
		}
		// ORDER BY arguments
		if (!entry.arg_orders.empty()) {
			result += " ORDER BY ";
			result += StringUtil::Join(entry.arg_orders, entry.arg_orders.size(), ", ",
			                           [](const ORDER_NODE &order) { return order.ToString(); });
		}

		// IGNORE NULLS
		if (entry.ignore_nulls) {
			result += " IGNORE NULLS";
		}
		// FILTER
		if (entry.filter_expr) {
			result += ") FILTER (WHERE " + entry.filter_expr->ToString();
		}

		// Over clause
		result += ") OVER (";
		string sep;

		// Partitions
		if (!entry.partitions.empty()) {
			result += "PARTITION BY ";
			result += StringUtil::Join(entry.partitions, entry.partitions.size(), ", ",
			                           [](const unique_ptr<BASE> &partition) { return partition->ToString(); });
			sep = " ";
		}

		// Orders
		if (!entry.orders.empty()) {
			result += sep;
			result += "ORDER BY ";
			result += StringUtil::Join(entry.orders, entry.orders.size(), ", ",
			                           [](const ORDER_NODE &order) { return order.ToString(); });
			sep = " ";
		}

		// Rows/Range
		string units = "ROWS";
		string from;
		switch (entry.start) {
		case WindowBoundary::CURRENT_ROW_RANGE:
		case WindowBoundary::CURRENT_ROW_ROWS:
		case WindowBoundary::CURRENT_ROW_GROUPS:
			from = "CURRENT ROW";
			units = ToUnits(entry.start, WindowBoundary::CURRENT_ROW_ROWS, WindowBoundary::CURRENT_ROW_RANGE,
			                WindowBoundary::CURRENT_ROW_GROUPS);
			break;
		case WindowBoundary::UNBOUNDED_PRECEDING:
			if (entry.end != WindowBoundary::CURRENT_ROW_RANGE) {
				from = "UNBOUNDED PRECEDING";
			}
			break;
		case WindowBoundary::EXPR_PRECEDING_ROWS:
		case WindowBoundary::EXPR_PRECEDING_RANGE:
		case WindowBoundary::EXPR_PRECEDING_GROUPS:
			from = entry.start_expr->ToString() + " PRECEDING";
			units = ToUnits(entry.start, WindowBoundary::EXPR_PRECEDING_ROWS, WindowBoundary::EXPR_PRECEDING_RANGE,
			                WindowBoundary::EXPR_PRECEDING_GROUPS);
			break;
		case WindowBoundary::EXPR_FOLLOWING_ROWS:
		case WindowBoundary::EXPR_FOLLOWING_RANGE:
		case WindowBoundary::EXPR_FOLLOWING_GROUPS:
			from = entry.start_expr->ToString() + " FOLLOWING";
			units = ToUnits(entry.start, WindowBoundary::EXPR_FOLLOWING_ROWS, WindowBoundary::EXPR_FOLLOWING_RANGE,
			                WindowBoundary::EXPR_FOLLOWING_GROUPS);
			break;
		case WindowBoundary::UNBOUNDED_FOLLOWING:
		case WindowBoundary::INVALID:
			throw InternalException("Unrecognized FROM in WindowExpression");
		}

		string to;
		switch (entry.end) {
		case WindowBoundary::CURRENT_ROW_RANGE:
			if (entry.start != WindowBoundary::UNBOUNDED_PRECEDING) {
				to = "CURRENT ROW";
				units = "RANGE";
			}
			break;
		case WindowBoundary::CURRENT_ROW_ROWS:
		case WindowBoundary::CURRENT_ROW_GROUPS:
			to = "CURRENT ROW";
			units = ToUnits(entry.end, WindowBoundary::CURRENT_ROW_ROWS, WindowBoundary::CURRENT_ROW_RANGE,
			                WindowBoundary::CURRENT_ROW_GROUPS);
			break;
		case WindowBoundary::UNBOUNDED_PRECEDING:
			to = "UNBOUNDED PRECEDING";
			break;
		case WindowBoundary::UNBOUNDED_FOLLOWING:
			to = "UNBOUNDED FOLLOWING";
			break;
		case WindowBoundary::EXPR_PRECEDING_ROWS:
		case WindowBoundary::EXPR_PRECEDING_RANGE:
		case WindowBoundary::EXPR_PRECEDING_GROUPS:
			to = entry.end_expr->ToString() + " PRECEDING";
			units = ToUnits(entry.end, WindowBoundary::EXPR_PRECEDING_ROWS, WindowBoundary::EXPR_PRECEDING_RANGE,
			                WindowBoundary::EXPR_PRECEDING_GROUPS);
			break;
		case WindowBoundary::EXPR_FOLLOWING_ROWS:
		case WindowBoundary::EXPR_FOLLOWING_RANGE:
		case WindowBoundary::EXPR_FOLLOWING_GROUPS:
			to = entry.end_expr->ToString() + " FOLLOWING";
			units = ToUnits(entry.end, WindowBoundary::EXPR_FOLLOWING_ROWS, WindowBoundary::EXPR_FOLLOWING_RANGE,
			                WindowBoundary::EXPR_FOLLOWING_GROUPS);
			break;
		case WindowBoundary::INVALID:
			throw InternalException("Unrecognized TO in WindowExpression");
		}
		if (entry.exclude_clause != WindowExcludeMode::NO_OTHER) {
			// if we have an explicit EXCLUDE we always need to fill in from/to
			if (from.empty()) {
				from = "UNBOUNDED PRECEDING";
			}
			if (to.empty()) {
				to = "CURRENT ROW";
				units = "RANGE";
			}
		}

		if (!from.empty() || !to.empty()) {
			result += sep + units;
		}
		if (!from.empty() && !to.empty()) {
			result += " BETWEEN ";
			result += from;
			result += " AND ";
			result += to;
		} else if (!from.empty()) {
			result += " ";
			result += from;
		} else if (!to.empty()) {
			result += " ";
			result += to;
		}

		if (entry.exclude_clause != WindowExcludeMode::NO_OTHER) {
			result += " EXCLUDE ";
		}
		switch (entry.exclude_clause) {
		case WindowExcludeMode::CURRENT_ROW:
			result += "CURRENT ROW";
			break;
		case WindowExcludeMode::GROUP:
			result += "GROUP";
			break;
		case WindowExcludeMode::TIES:
			result += "TIES";
			break;
		default:
			break;
		}

		result += ")";

		return result;
	}